

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

bool wallet::coinselector_tests::EqualResult(SelectionResult *a,SelectionResult *b)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>,_std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>_>
  ret;
  SelectionResult *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  _Self *in_stack_ffffffffffffff98;
  _Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_> *__x;
  bool local_52;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>,_std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>_>
  local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SelectionResult::GetInputSet(in_stack_ffffffffffffff88);
  iVar2 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::begin((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  SelectionResult::GetInputSet(in_stack_ffffffffffffff88);
  iVar3 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::end((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  SelectionResult::GetInputSet(in_stack_ffffffffffffff88);
  iVar4 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::begin((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  local_18 = std::
             mismatch<std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>>,std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>>,wallet::coinselector_tests::EqualResult(wallet::SelectionResult_const&,wallet::SelectionResult_const&)::__0>
                       (iVar2._M_node,iVar3._M_node,iVar4._M_node);
  SelectionResult::GetInputSet(in_stack_ffffffffffffff88);
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::end((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
         *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  bVar1 = std::operator==(in_stack_ffffffffffffff98,
                          (_Self *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  local_52 = false;
  if (bVar1) {
    __x = &local_18.second;
    SelectionResult::GetInputSet(in_stack_ffffffffffffff88);
    std::
    set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::end((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    local_52 = std::operator==(__x,(_Self *)CONCAT17(in_stack_ffffffffffffff97,
                                                     in_stack_ffffffffffffff90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_52;
}

Assistant:

static bool EqualResult(const SelectionResult& a, const SelectionResult& b)
{
    std::pair<CoinSet::iterator, CoinSet::iterator> ret = std::mismatch(a.GetInputSet().begin(), a.GetInputSet().end(), b.GetInputSet().begin(),
        [](const std::shared_ptr<COutput>& a, const std::shared_ptr<COutput>& b) {
            return a->outpoint == b->outpoint;
        });
    return ret.first == a.GetInputSet().end() && ret.second == b.GetInputSet().end();
}